

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O0

void __thiscall
SphericalTriangleArea_RandomSampling_Test::TestBody(SphericalTriangleArea_RandomSampling_Test *this)

{
  initializer_list<float> __l;
  bool bVar1;
  char *pcVar2;
  int __x;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Vector3f VVar17;
  Vector3<float> VVar18;
  Point3f *in_stack_000000d8;
  Point3f *in_stack_000000e0;
  Point3f *in_stack_000000e8;
  Float in_stack_000000f4;
  AssertionResult gtest_ar;
  Float error;
  Float estA;
  Float pdf;
  Vector3f v;
  Point2f u;
  Hammersley2DIter __end2;
  Hammersley2DIter __begin2;
  Hammersley2D *__range2;
  int count;
  int sqrtN;
  bool sampleSphere;
  Float area;
  Float cosTheta;
  Frame frame;
  Vector3f axis;
  Vector3f c;
  Vector3f b;
  Vector3f a;
  RNG rng;
  int i;
  float in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc8c;
  RNG *in_stack_fffffffffffffc90;
  Vector3<float> *in_stack_fffffffffffffc98;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffca0;
  Point3f *in_stack_fffffffffffffca8;
  Ray *in_stack_fffffffffffffcb0;
  Message *in_stack_fffffffffffffcb8;
  AssertHelper *in_stack_fffffffffffffcc0;
  float local_314;
  Message *in_stack_fffffffffffffd08;
  AssertHelper *in_stack_fffffffffffffd10;
  optional *in_stack_fffffffffffffd28;
  uint in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd40;
  float *val1;
  undefined4 in_stack_fffffffffffffd58;
  AssertionResult local_280;
  float local_270;
  float local_26c;
  float local_268;
  Vector3f *in_stack_fffffffffffffdb8;
  Vector3f *in_stack_fffffffffffffdc0;
  Vector3f *in_stack_fffffffffffffdc8;
  Message local_218 [5];
  optional local_1ec [20];
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_1c4;
  float local_1bc;
  undefined8 local_1b8;
  float local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_184;
  float local_17c;
  undefined8 local_178;
  float local_170;
  undefined8 local_16c;
  IndexingIterator<pbrt::detail::Hammersley2DIter> local_164;
  IndexingIterator<pbrt::detail::Hammersley2DIter> local_15c;
  undefined1 local_154 [4];
  undefined1 *local_150;
  int local_144;
  int local_140;
  byte local_139;
  Float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float *local_128;
  undefined8 local_120;
  float local_118;
  Tuple3<pbrt::Vector3,_float> local_f0;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  Tuple3<pbrt::Vector3,_float> local_a4;
  Tuple3<pbrt::Vector3,_float> local_98 [2];
  Tuple3<pbrt::Vector3,_float> local_80;
  Tuple3<pbrt::Vector3,_float> local_70;
  float local_60 [2];
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48 [2];
  Tuple3<pbrt::Vector3,_float> local_30;
  char local_20 [20];
  int local_c;
  undefined1 auVar16 [56];
  undefined1 extraout_var [56];
  
  for (local_c = 0; local_c < 100; local_c = local_c + 1) {
    pcVar2 = local_20;
    pbrt::RNG::RNG(in_stack_fffffffffffffc90,
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    fVar3 = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffc90);
    pbrt::RNG::Uniform<float>(in_stack_fffffffffffffc90);
    auVar16 = (undefined1  [56])0x0;
    pbrt::Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
               in_stack_fffffffffffffc88);
    VVar17 = pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffffcb0);
    local_48[0].z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar16;
    local_48[0]._0_8_ = vmovlpd_avx(auVar6._0_16_);
    local_30._0_8_ = local_48[0]._0_8_;
    local_30.z = local_48[0].z;
    fVar4 = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffc90);
    pbrt::RNG::Uniform<float>(in_stack_fffffffffffffc90);
    auVar16 = (undefined1  [56])0x0;
    val1 = local_60;
    pbrt::Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
               in_stack_fffffffffffffc88);
    VVar17 = pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffffcb0);
    local_70.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar16;
    local_70._0_8_ = vmovlpd_avx(auVar7._0_16_);
    local_58._0_8_ = local_70._0_8_;
    local_58.z = local_70.z;
    fVar5 = pbrt::RNG::Uniform<float>(in_stack_fffffffffffffc90);
    pbrt::RNG::Uniform<float>(in_stack_fffffffffffffc90);
    auVar16 = (undefined1  [56])0x0;
    pbrt::Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
               in_stack_fffffffffffffc88);
    VVar17 = pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffffcb0);
    local_98[0].z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar16;
    local_98[0]._0_8_ = vmovlpd_avx(auVar8._0_16_);
    local_80._0_8_ = local_98[0]._0_8_;
    local_80.z = local_98[0].z;
    VVar18 = pbrt::Tuple3<pbrt::Vector3,float>::operator+
                       (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    local_c8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar16;
    local_d0 = vmovlpd_avx(auVar9._0_16_);
    local_c0 = local_d0;
    local_b8 = local_c8;
    VVar18 = pbrt::Tuple3<pbrt::Vector3,float>::operator+
                       (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    local_d8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar16;
    local_e0 = vmovlpd_avx(auVar10._0_16_);
    local_b0 = local_e0;
    local_a8 = local_d8;
    VVar18 = pbrt::Normalize<float>((Vector3<float> *)in_stack_fffffffffffffcb0);
    local_f0.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar16;
    local_f0._0_8_ = vmovlpd_avx(auVar11._0_16_);
    local_a4._0_8_ = local_f0._0_8_;
    local_a4.z = local_f0.z;
    pbrt::Frame::FromZ((Vector3f *)in_stack_fffffffffffffcb0);
    local_134 = pbrt::Dot<float>((Vector3<float> *)&local_30,(Vector3<float> *)&local_a4);
    local_130 = pbrt::Dot<float>((Vector3<float> *)&local_58,(Vector3<float> *)&local_a4);
    local_12c = pbrt::Dot<float>((Vector3<float> *)&local_80,(Vector3<float> *)&local_a4);
    local_128 = &local_134;
    local_120 = 3;
    __l._M_array._4_4_ = in_stack_fffffffffffffc8c;
    __l._M_array._0_4_ = in_stack_fffffffffffffc88;
    __l._M_len = (size_type)in_stack_fffffffffffffc90;
    local_118 = std::min<float>(__l);
    local_138 = pbrt::SphericalTriangleArea
                          (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                           in_stack_fffffffffffffdb8);
    local_139 = 3.1415927 < local_138;
    local_140 = 200;
    local_144 = 0;
    pbrt::Hammersley2D::IndexingGenerator
              ((Hammersley2D *)in_stack_fffffffffffffc90,(int)in_stack_fffffffffffffc8c);
    local_150 = local_154;
    local_15c = (IndexingIterator<pbrt::detail::Hammersley2DIter>)
                pbrt::detail::IndexingGenerator<pbrt::Hammersley2D,_pbrt::detail::Hammersley2DIter>
                ::begin((IndexingGenerator<pbrt::Hammersley2D,_pbrt::detail::Hammersley2DIter> *)
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_164 = (IndexingIterator<pbrt::detail::Hammersley2DIter>)
                pbrt::detail::IndexingGenerator<pbrt::Hammersley2D,_pbrt::detail::Hammersley2DIter>
                ::end((IndexingGenerator<pbrt::Hammersley2D,_pbrt::detail::Hammersley2DIter> *)
                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    while( true ) {
      __x = (int)&local_15c;
      bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Hammersley2DIter>::operator!=
                        ((IndexingIterator<pbrt::detail::Hammersley2DIter> *)
                         in_stack_fffffffffffffc90,
                         (Hammersley2DIter *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (!bVar1) break;
      auVar12._0_8_ =
           pbrt::detail::Hammersley2DIter::operator*
                     ((Hammersley2DIter *)
                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      auVar12._8_56_ = extraout_var;
      local_16c = vmovlpd_avx(auVar12._0_16_);
      auVar16 = extraout_var;
      pbrt::Vector3<float>::Vector3((Vector3<float> *)0x68389f);
      if ((local_139 & 1) == 0) {
        auVar16 = (undefined1  [56])0x0;
        VVar17 = pbrt::SampleUniformCone
                           ((Point2f *)in_stack_fffffffffffffcc0,
                            (Float)((ulong)in_stack_fffffffffffffcb8 >> 0x20));
        local_1b0 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar14._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar14._8_56_ = auVar16;
        local_1b8 = vmovlpd_avx(auVar14._0_16_);
        local_1a8 = local_1b8;
        local_1a0 = local_1b0;
        local_178 = local_1b8;
        local_170 = local_1b0;
        VVar17 = pbrt::Frame::FromLocal
                           ((Frame *)CONCAT44(fVar3,in_stack_fffffffffffffd30),
                            (Vector3f *)in_stack_fffffffffffffd28);
        local_1d0 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar15._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar15._8_56_ = auVar16;
        local_1d8 = vmovlpd_avx(auVar15._0_16_);
        local_1c4 = local_1d8;
        local_1bc = local_1d0;
        local_178 = local_1d8;
        local_170 = local_1d0;
      }
      else {
        VVar17 = pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffffcb0);
        local_190 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar13._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar13._8_56_ = auVar16;
        local_198 = vmovlpd_avx(auVar13._0_16_);
        local_184 = local_198;
        local_17c = local_190;
        local_178 = local_198;
        local_170 = local_190;
      }
      pbrt::Point3<float>::Point3
                ((Point3<float> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                 in_stack_fffffffffffffc88,0.0);
      pbrt::MediumHandle::TaggedPointer
                ((MediumHandle *)in_stack_fffffffffffffc90,
                 (nullptr_t)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffd08 = local_218;
      pbrt::Ray::Ray(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                     (Vector3f *)in_stack_fffffffffffffca0,
                     (Float)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                     (MediumHandle *)in_stack_fffffffffffffc90);
      in_stack_fffffffffffffd10 = (AssertHelper *)&stack0xfffffffffffffdc4;
      pbrt::Point3<float>::Point3<float>
                ((Point3<float> *)in_stack_fffffffffffffc90,
                 (Vector3<float> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      pbrt::Point3<float>::Point3<float>
                ((Point3<float> *)in_stack_fffffffffffffc90,
                 (Vector3<float> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      pbrt::Point3<float>::Point3<float>
                ((Point3<float> *)in_stack_fffffffffffffc90,
                 (Vector3<float> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffd28 = local_1ec;
      pbrt::IntersectTriangle
                ((Ray *)gtest_ar._0_8_,in_stack_000000f4,in_stack_000000e8,in_stack_000000e0,
                 in_stack_000000d8);
      bVar1 = pstd::optional::operator_cast_to_bool(in_stack_fffffffffffffd28);
      in_stack_fffffffffffffd30 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd30);
      pstd::optional<pbrt::TriangleIntersection>::~optional
                ((optional<pbrt::TriangleIntersection> *)0x683aee);
      if ((in_stack_fffffffffffffd30 & 0x1000000) != 0) {
        local_144 = local_144 + 1;
      }
      pbrt::detail::IndexingIterator<pbrt::detail::Hammersley2DIter>::operator++(&local_15c);
    }
    if ((local_139 & 1) == 0) {
      local_314 = pbrt::UniformConePDF(local_118);
    }
    else {
      local_314 = pbrt::UniformSpherePDF();
    }
    local_268 = local_314;
    local_26c = (float)local_144 / ((float)(local_140 * local_140) * local_314);
    fVar3 = (local_26c - local_138) / local_138;
    std::abs(__x);
    local_270 = fVar3;
    testing::internal::CmpHelperLT<float,float>
              ((char *)CONCAT44(fVar5,in_stack_fffffffffffffd58),pcVar2,val1,
               (float *)CONCAT44(fVar4,in_stack_fffffffffffffd40));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcc0);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffc90,
                 (char (*) [6])CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffc90,
                 (float *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffc90,
                 (char (*) [12])CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffcc0 =
           (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffc90,
                      (float *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffcb8 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffc90,
                      (char (*) [8])CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffcb0 =
           (Ray *)testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffc90,
                             (Vector3<float> *)
                             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffca8 =
           (Point3f *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffc90,
                      (char (*) [8])CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffca0 =
           (Tuple3<pbrt::Vector3,_float> *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffc90,
                      (Vector3<float> *)
                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffc98 =
           (Vector3<float> *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffc90,
                      (char (*) [8])CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      in_stack_fffffffffffffc90 =
           (RNG *)testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffc90,
                             (Vector3<float> *)
                             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x683d62);
      in_stack_fffffffffffffc88 = SUB84(pcVar2,0);
      in_stack_fffffffffffffc8c = (float)((ulong)pcVar2 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffcc0,(Type)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                 (char *)in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                 (char *)in_stack_fffffffffffffca0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc90);
      testing::Message::~Message((Message *)0x683dba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x683e0f);
  }
  return;
}

Assistant:

TEST(SphericalTriangleArea, RandomSampling) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Vector3f a = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f b = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f c = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Vector3f axis = Normalize(a + b + c);
        Frame frame = Frame::FromZ(axis);
        Float cosTheta = std::min({Dot(a, axis), Dot(b, axis), Dot(c, axis)});

        Float area = SphericalTriangleArea(a, b, c);
        bool sampleSphere = area > Pi;
        int sqrtN = 200;
        int count = 0;
        for (Point2f u : Hammersley2D(sqrtN * sqrtN)) {
            Vector3f v;
            if (sampleSphere)
                v = SampleUniformSphere(u);
            else {
                v = SampleUniformCone(u, cosTheta);
                v = frame.FromLocal(v);
            }

            if (IntersectTriangle(Ray(Point3f(0, 0, 0), v), Infinity, Point3f(a),
                                  Point3f(b), Point3f(c)))
                ++count;
        }

        Float pdf = sampleSphere ? UniformSpherePDF() : UniformConePDF(cosTheta);
        Float estA = Float(count) / (sqrtN * sqrtN * pdf);

        Float error = std::abs((estA - area) / area);
        EXPECT_LT(error, 0.035f) << "Area " << area << ", estimate " << estA
                                 << ", va = " << a << ", vb = " << b << ", vc = " << c;
    }
}